

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void __thiscall absl::lts_20250127::log_internal::LogMessage::Flush(LogMessage *this)

{
  LogSeverity LVar1;
  LogMessageData *this_00;
  LogMessageData *pLVar2;
  bool bVar3;
  LogSeverityAtLeast LVar4;
  LogMessage *this_01;
  int errnum;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  int local_44;
  string local_40;
  
  LVar1 = (((this->data_)._M_t.
            super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            ._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl)->entry).severity_;
  LVar4 = MinLogLevel();
  if ((int)LVar4 <= (int)LVar1) {
    if (((this->data_)._M_t.
         super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         ._M_t.
         super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         .
         super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl)->is_perror == true) {
      str._M_str = ": ";
      str._M_len = 2;
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this,str);
      base_internal::StrError_abi_cxx11_
                (&local_40,(base_internal *)(ulong)(uint)(this->errno_saver_).saved_errno_,errnum);
      str_00._M_str = local_40._M_dataplus._M_p;
      str_00._M_len = local_40._M_string_length;
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)1>(this,str_00);
      str_01._M_str = " [";
      str_01._M_len = 2;
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this,str_01);
      local_44 = (this->errno_saver_).saved_errno_;
      this_01 = operator<<<int,_0>(this,&local_44);
      str_02._M_str = "]";
      str_02._M_len = 1;
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                (this_01,str_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    if (((((this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
          ._M_head_impl)->entry).severity_ == kFatal) && (bVar3 = ExitOnDFatal(), bVar3)) {
      LOCK();
      bVar3 = Flush::seen_fatal._M_base._M_i == false;
      if (bVar3) {
        Flush::seen_fatal._M_base._M_i = (__atomic_base<bool>)true;
      }
      UNLOCK();
      if (bVar3) {
        ((this->data_)._M_t.
         super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         ._M_t.
         super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         .
         super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
        ._M_head_impl)->first_fatal = true;
      }
    }
    LogMessageData::FinalizeEncodingAndFormat
              ((this->data_)._M_t.
               super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               ._M_t.
               super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
               .
               super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
               ._M_head_impl);
    this_00 = (this->data_)._M_t.
              super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              ._M_t.
              super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
              .
              super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
              ._M_head_impl;
    if ((this_00->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (this_00->encoded_remaining_actual_do_not_use_directly).ptr_ = (this_00->encoded_buf)._M_elems
      ;
      (this_00->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(this_00);
    }
    pLVar2 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    (pLVar2->entry).encoding_._M_len =
         (size_t)((this_00->encoded_remaining_actual_do_not_use_directly).ptr_ +
                 (-0x230 - (long)pLVar2));
    *(array<char,_15000UL> **)((long)&(pLVar2->entry).encoding_ + 8) = &this_00->encoded_buf;
    SendToLog(this);
  }
  return;
}

Assistant:

void LogMessage::Flush() {
  if (data_->entry.log_severity() < absl::MinLogLevel()) return;

  if (data_->is_perror) {
    InternalStream() << ": " << absl::base_internal::StrError(errno_saver_())
                     << " [" << errno_saver_() << "]";
  }

  // Have we already seen a fatal message?
  ABSL_CONST_INIT static std::atomic<bool> seen_fatal(false);
  if (data_->entry.log_severity() == absl::LogSeverity::kFatal &&
      absl::log_internal::ExitOnDFatal()) {
    // Exactly one LOG(FATAL) message is responsible for aborting the process,
    // even if multiple threads LOG(FATAL) concurrently.
    bool expected_seen_fatal = false;
    if (seen_fatal.compare_exchange_strong(expected_seen_fatal, true,
                                           std::memory_order_relaxed)) {
      data_->first_fatal = true;
    }
  }

  data_->FinalizeEncodingAndFormat();
  data_->entry.encoding_ =
      absl::string_view(data_->encoded_buf.data(),
                        static_cast<size_t>(data_->encoded_remaining().data() -
                                            data_->encoded_buf.data()));
  SendToLog();
}